

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O2

void __thiscall
ear::PolarSpeakerPosition::PolarSpeakerPosition
          (PolarSpeakerPosition *this,PolarSpeakerPosition *param_1)

{
  long lVar1;
  PolarSpeakerPosition *pPVar2;
  PolarSpeakerPosition *pPVar3;
  
  pPVar2 = param_1;
  pPVar3 = this;
  for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
    pPVar3->azimuth = pPVar2->azimuth;
    pPVar2 = (PolarSpeakerPosition *)&pPVar2->azimuthMin;
    pPVar3 = (PolarSpeakerPosition *)&pPVar3->azimuthMin;
  }
  ScreenEdgeLock::ScreenEdgeLock(&this->screenEdgeLock,&param_1->screenEdgeLock);
  return;
}

Assistant:

struct EAR_EXPORT PolarSpeakerPosition {
    PolarSpeakerPosition(double az = 0.0, double el = 0.0, double dist = 1.0)
        : azimuth(az), elevation(el), distance(dist){};
    double azimuth;
    boost::optional<double> azimuthMin;
    boost::optional<double> azimuthMax;
    double elevation;
    boost::optional<double> elevationMin;
    boost::optional<double> elevationMax;
    double distance;
    boost::optional<double> distanceMin;
    boost::optional<double> distanceMax;
    ScreenEdgeLock screenEdgeLock;
  }